

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O2

FormulaList *
Kernel::SubstHelper::
applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
          (FormulaList *fs,Substitution *applicator,bool noSharing)

{
  Formula *f;
  FormulaList *pFVar1;
  Formula *pFVar2;
  FormulaList *pFVar3;
  FormulaList *pFVar4;
  Stack<Lib::List<Kernel::Formula_*>_*> local_58;
  
  if (fs == (FormulaList *)0x0) {
    pFVar4 = (FormulaList *)0x0;
  }
  else {
    local_58._cursor = (List<Kernel::Formula_*> **)0x0;
    local_58._end = (List<Kernel::Formula_*> **)0x0;
    local_58._capacity = 0;
    local_58._stack = (List<Kernel::Formula_*> **)0x0;
    for (; fs != (List<Kernel::Formula_*> *)0x0; fs = fs->_tail) {
      Lib::Stack<Lib::List<Kernel::Formula_*>_*>::push(&local_58,fs);
    }
    pFVar3 = local_58._cursor[-1]->_tail;
    while (pFVar4 = pFVar3, local_58._cursor != local_58._stack) {
      pFVar3 = local_58._cursor[-1];
      f = pFVar3->_head;
      pFVar1 = pFVar3->_tail;
      local_58._cursor = local_58._cursor + -1;
      pFVar2 = applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                         (f,applicator,noSharing);
      if (f != pFVar2 || pFVar1 != pFVar4) {
        pFVar3 = (FormulaList *)Lib::List<Kernel::Formula*>::operator_new(0x10);
        pFVar3->_head = pFVar2;
        pFVar3->_tail = pFVar4;
      }
    }
    Lib::Stack<Lib::List<Kernel::Formula_*>_*>::~Stack(&local_58);
  }
  return pFVar4;
}

Assistant:

FormulaList* SubstHelper::applyImpl(FormulaList* fs, Applicator& applicator, bool noSharing)
{
  if (FormulaList::isEmpty(fs)) {
    return fs;
  }

  Stack<FormulaList*> args;
  while (FormulaList::isNonEmpty(fs)) {
    args.push(fs);
    fs = fs->tail();
  }

  FormulaList* res = args.top()->tail();
  ASS(FormulaList::isEmpty(res));

  while (args.isNonEmpty()) {
    fs = args.pop();
    Formula* g = fs->head();
    FormulaList* gs = fs->tail();
    Formula* h = applyImpl<ProcessSpecVars>(g, applicator, noSharing);
    FormulaList* hs = res; // = applyImpl<ProcessSpecVars>(gs, applicator, noSharing);

    if (gs == hs && g == h) {
      res = fs;
    } else {
      res = new FormulaList(h,hs);
    }
  }

  return res;
}